

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDFace::PackRectRotationDegrees(ON_SubDFace *this)

{
  byte bVar1;
  uint local_1c;
  uint packing_rotation_degrees;
  ON_SubDFace *this_local;
  
  if ((this->m_pack_status_bits & 4) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_1c = 0;
    bVar1 = this->m_pack_status_bits & 3;
    if (bVar1 == 1) {
      local_1c = 0x5a;
    }
    else if (bVar1 == 2) {
      local_1c = 0xb4;
    }
    else if (bVar1 == 3) {
      local_1c = 0x10e;
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDFace::PackRectRotationDegrees() const
{
  if (0 == (m_pack_status_bits & ON_SubDFace::PackStatusBits::PackRectSet))
    return 0;
  unsigned int packing_rotation_degrees = 0;
  switch (m_pack_status_bits & ON_SubDFace::PackStatusBits::PackingRotateMask)
  {
  case ON_SubDFace::PackStatusBits::PackingRotate90:
    packing_rotation_degrees = 90;
    break;
  case ON_SubDFace::PackStatusBits::PackingRotate180:
    packing_rotation_degrees = 180;
    break;
  case ON_SubDFace::PackStatusBits::PackingRotate270:
    packing_rotation_degrees = 270;
    break;
  }
  return packing_rotation_degrees;
}